

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.cpp
# Opt level: O0

Color4<double> * Imath_3_2::rgb2hsv_d(Color4<double> *c)

{
  double *pdVar1;
  double *pdVar2;
  double *in_RSI;
  Color4<double> *in_RDI;
  double h;
  double hue;
  double sat;
  double val;
  double range;
  double min;
  double max;
  double *b;
  double *g;
  double *r;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_60;
  double local_58;
  double local_50;
  
  pdVar1 = in_RSI + 1;
  pdVar2 = in_RSI + 2;
  if (*in_RSI < *pdVar1 || *in_RSI == *pdVar1) {
    if (*pdVar1 < *pdVar2 || *pdVar1 == *pdVar2) {
      local_88 = *pdVar2;
    }
    else {
      local_88 = *pdVar1;
    }
    local_80 = local_88;
  }
  else {
    if (*in_RSI < *pdVar2 || *in_RSI == *pdVar2) {
      local_78 = *pdVar2;
    }
    else {
      local_78 = *in_RSI;
    }
    local_80 = local_78;
  }
  if (*pdVar1 <= *in_RSI) {
    if (*pdVar2 <= *pdVar1) {
      local_a0 = *pdVar2;
    }
    else {
      local_a0 = *pdVar1;
    }
    local_98 = local_a0;
  }
  else {
    if (*pdVar2 <= *in_RSI) {
      local_90 = *pdVar2;
    }
    else {
      local_90 = *in_RSI;
    }
    local_98 = local_90;
  }
  local_98 = local_80 - local_98;
  local_50 = 0.0;
  local_58 = 0.0;
  if ((local_80 != 0.0) || (NAN(local_80))) {
    local_50 = local_98 / local_80;
  }
  if ((local_50 != 0.0) || (NAN(local_50))) {
    if ((*in_RSI != local_80) || (NAN(*in_RSI) || NAN(local_80))) {
      if ((*pdVar1 != local_80) || (NAN(*pdVar1) || NAN(local_80))) {
        local_60 = (*in_RSI - *pdVar1) / local_98 + 4.0;
      }
      else {
        local_60 = (*pdVar2 - *in_RSI) / local_98 + 2.0;
      }
    }
    else {
      local_60 = (*pdVar1 - *pdVar2) / local_98;
    }
    local_58 = local_60 / 6.0;
    if (local_58 < 0.0) {
      local_58 = local_58 + 1.0;
    }
  }
  Color4<double>::Color4(in_RDI,local_58,local_50,local_80,in_RSI[3]);
  return in_RDI;
}

Assistant:

Color4<double>
rgb2hsv_d (const Color4<double>& c) IMATH_NOEXCEPT
{
    const double& r = c.r;
    const double& g = c.g;
    const double& b = c.b;

    double max   = (r > g) ? ((r > b) ? r : b) : ((g > b) ? g : b);
    double min   = (r < g) ? ((r < b) ? r : b) : ((g < b) ? g : b);
    double range = max - min;
    double val   = max;
    double sat   = 0;
    double hue   = 0;

    if (max != 0) sat = range / max;

    if (sat != 0)
    {
        double h;

        if (r == max)
            h = (g - b) / range;
        else if (g == max)
            h = 2 + (b - r) / range;
        else
            h = 4 + (r - g) / range;

        hue = h / 6.;

        if (hue < 0.) hue += 1.0;
    }
    return Color4<double> (hue, sat, val, c.a);
}